

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall QTextBrowser::clearHistory(QTextBrowser *this)

{
  QList<QTextBrowserPrivate::HistoryEntry> *this_00;
  long lVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  HistoryEntry historyEntry;
  undefined1 local_68 [40];
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.
                    field_0x8;
  QList<QTextBrowserPrivate::HistoryEntry>::clear
            ((QList<QTextBrowserPrivate::HistoryEntry> *)(lVar1 + 0x3e0));
  if (*(long *)(lVar1 + 0x3d8) != 0) {
    this_00 = (QList<QTextBrowserPrivate::HistoryEntry> *)(lVar1 + 0x3c8);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = QList<QTextBrowserPrivate::HistoryEntry>::end(this_00);
    QTextBrowserPrivate::HistoryEntry::HistoryEntry((HistoryEntry *)local_68,iVar2.i + -1);
    QList<QTextBrowserPrivate::HistoryEntry>::clear(this_00);
    QList<QTextBrowserPrivate::HistoryEntry>::emplaceBack<QTextBrowserPrivate::HistoryEntry_const&>
              (this_00,(HistoryEntry *)local_68);
    QUrl::operator=((QUrl *)(lVar1 + 0x3f8),(QUrl *)local_68);
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry((HistoryEntry *)local_68);
  }
  forwardAvailable(this,false);
  backwardAvailable(this,false);
  historyChanged(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::clearHistory()
{
    Q_D(QTextBrowser);
    d->forwardStack.clear();
    if (!d->stack.isEmpty()) {
        QTextBrowserPrivate::HistoryEntry historyEntry = d->stack.top();
        d->stack.clear();
        d->stack.push(historyEntry);
        d->home = historyEntry.url;
    }
    emit forwardAvailable(false);
    emit backwardAvailable(false);
    emit historyChanged();
}